

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

shared_ptr<chatra::Node> __thiscall
chatra::
parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
          (chatra *this,ParserContext *ct,
          __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
          first,__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                last)

{
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  first_00;
  pointer *pppTVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TokenType TVar3;
  int iVar4;
  Token *pTVar5;
  iterator iVar6;
  element_type *peVar7;
  OperatorPattern *pOVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer ppTVar10;
  Token *pTVar11;
  long lVar12;
  char *pcVar13;
  undefined1 auVar14 [8];
  pointer psVar15;
  shared_ptr<chatra::Node> *psVar16;
  long lVar17;
  iterator iVar18;
  iterator it;
  ulong uVar19;
  int iVar20;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last_00;
  char *pcVar21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  byte bVar22;
  OperatorPattern *pattern;
  Token **ppTVar23;
  OperatorPattern *pOVar24;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  __args;
  undefined1 auVar25 [8];
  bool bVar26;
  shared_ptr<chatra::Node> sVar27;
  element_type *peStack_98;
  size_type __dnew;
  pointer local_88;
  Token *local_80;
  undefined1 auStack_78 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> nodes;
  undefined1 auStack_58 [8];
  shared_ptr<chatra::Node> n;
  
  auStack_78 = (undefined1  [8])0x0;
  nodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = (Token *)ct;
  if (first._M_current != last._M_current) {
    __args._M_current = first._M_current;
    do {
      pTVar5 = *__args._M_current;
      TVar3 = pTVar5->type;
      if ((TVar3 == Number) || (TVar3 == String)) {
LAB_0019e96d:
        parseAsLiteral((ParserContext *)auStack_58,local_80);
        std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        emplace_back<std::shared_ptr<chatra::Node>>
                  ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_78,(shared_ptr<chatra::Node> *)auStack_58);
LAB_0019e988:
        if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        ppTVar23 = __args._M_current + 1;
      }
      else {
        if (TVar3 != OpenBracket) {
          if (pTVar5->sid - Null < 3) goto LAB_0019e96d;
          if (TVar3 == Operator) {
            auStack_58 = (undefined1  [8])0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            psVar16 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                                ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  *)auStack_78,(shared_ptr<chatra::Line> *)auStack_58,Unknown);
            peVar7 = (psVar16->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            iVar6._M_current =
                 (peVar7->tokens).
                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (peVar7->tokens).
                super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
              _M_realloc_insert<chatra::Token_const*const&>
                        ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)
                         &peVar7->tokens,iVar6,__args._M_current);
            }
            else {
              *iVar6._M_current = *__args._M_current;
              pppTVar1 = &(peVar7->tokens).
                          super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
            goto LAB_0019e988;
          }
          if (TVar3 == Name) {
            auStack_58 = (undefined1  [8])0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            psVar16 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                                ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  *)auStack_78,(shared_ptr<chatra::Line> *)auStack_58,Name);
            if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            }
            pTVar5 = *__args._M_current;
            peVar7 = (psVar16->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            peVar7->sid = pTVar5->sid;
            ppTVar23 = __args._M_current + 1;
            iVar6._M_current =
                 (peVar7->tokens).
                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (peVar7->tokens).
                super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
              _M_realloc_insert<chatra::Token_const*const&>
                        ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)
                         &peVar7->tokens,iVar6,__args._M_current);
            }
            else {
              *iVar6._M_current = pTVar5;
              pppTVar1 = &(peVar7->tokens).
                          super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
            goto LAB_0019e99d;
          }
          p_Var2 = &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          peStack_98 = (element_type *)0x13;
          auStack_58 = (undefined1  [8])p_Var2;
          auStack_58 = (undefined1  [8])
                       std::__cxx11::string::_M_create
                                 ((ulong *)auStack_58,(ulong)&stack0xffffffffffffff68);
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_98;
          *(undefined8 *)auStack_58 = 0x6465746365707865;
          *(undefined8 *)((long)auStack_58 + 8) = 0x7373657270786520;
          builtin_strncpy((char *)((long)&((ParserWorkingSet *)((long)auStack_58 + 0xc))->
                                          generatedVarCount + 3),"sion",4);
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
          (&peStack_98->type)[(long)&((ParserWorkingSet *)auStack_58)->generatedVarCount] = Unknown;
          peStack_98 = (element_type *)0x0;
          __dnew = 0;
          local_88 = (pointer)0x0;
          ParserContext::errorAtToken
                    ((ParserContext *)local_80,Error,pTVar5,(string *)auStack_58,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffff68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xffffffffffffff68);
          if (auStack_58 != (undefined1  [8])p_Var2) {
            operator_delete((void *)auStack_58);
          }
          psVar15 = nodes.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          auVar14 = auStack_78;
          auVar25 = auStack_78;
          if ((undefined1  [8])
              nodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start != auStack_78) {
            do {
              p_Var9 = (((shared_ptr<chatra::Node> *)auVar25)->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                       _M_pi;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              auVar25 = (undefined1  [8])((long)auVar25 + 0x10);
            } while (auVar25 != (undefined1  [8])psVar15);
            nodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar14;
          }
          break;
        }
        auStack_58 = (undefined1  [8])0x0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        psVar16 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              *)auStack_78,(shared_ptr<chatra::Line> *)auStack_58,Unknown);
        if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        first_00._M_current = __args._M_current + 1;
        if (first_00._M_current == last._M_current) {
          bVar26 = true;
          last_00._M_current = first_00._M_current;
        }
        else {
          lVar17 = 8;
          iVar20 = 0;
          do {
            iVar4 = *(int *)(*(long *)((long)__args._M_current + lVar17) + 0x28);
            if (iVar4 == 6) {
              if (iVar20 == 0) break;
              iVar20 = iVar20 + -1;
            }
            else if (iVar4 == 5) {
              iVar20 = iVar20 + 1;
            }
            lVar12 = lVar17 + 8;
            lVar17 = lVar17 + 8;
          } while (__args._M_current + lVar12 != last._M_current);
          bVar26 = lVar17 == 8;
          last_00._M_current = __args._M_current + lVar17;
        }
        peVar7 = (psVar16->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        ppTVar23 = last_00._M_current + 1;
        std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)
                   &peVar7->tokens,
                   (peVar7->tokens).
                   super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args._M_current);
        peVar7 = (psVar16->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (bVar26) {
          auStack_58 = (undefined1  [8])0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
        }
        else {
          parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                    ((chatra *)auStack_58,(ParserContext *)local_80,first_00,last_00);
        }
        std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        emplace_back<std::shared_ptr<chatra::Node>>
                  ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)&peVar7->subNodes,(shared_ptr<chatra::Node> *)auStack_58);
        if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
LAB_0019e99d:
      __args._M_current = ppTVar23;
    } while (ppTVar23 != last._M_current);
  }
  pcVar13 = DAT_002584e8;
  if (auStack_78 !=
      (undefined1  [8])
      nodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if (opPatterns != DAT_002584e8) {
      pcVar21 = opPatterns;
      do {
        iVar18._M_current =
             nodes.
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        it._M_current = (shared_ptr<chatra::Node> *)auStack_78;
        if (*pcVar21 == '\x01') {
          for (; it._M_current !=
                 nodes.
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
              it._M_current =
                   (shared_ptr<chatra::Node> *)
                   ((long)&((it._M_current)->
                           super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   uVar19)) {
            pOVar24 = *(OperatorPattern **)(pcVar21 + 8);
            pOVar8 = *(OperatorPattern **)(pcVar21 + 0x10);
            if (pOVar24 == pOVar8) {
              uVar19 = 0x10;
            }
            else {
              bVar22 = 0;
              do {
                if ((ulong)((long)(pOVar24->elements).
                                  super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pOVar24->elements).
                                 super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                 ._M_impl.super__Vector_impl_data._M_start) <=
                    (ulong)((long)nodes.
                                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)it._M_current))
                {
                  extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            ((chatra *)auStack_58,
                             (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                              )auStack_78,
                             (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                              )it._M_current,pOVar24);
                  if (auStack_58 != (undefined1  [8])0x0) {
                    iVar18 = std::
                             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                         *)auStack_78,it,
                                        ((long)(pOVar24->elements).
                                               super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pOVar24->elements).
                                              super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                              ._M_impl.super__Vector_impl_data._M_start) +
                                        it._M_current);
                    it = std::
                         vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   *)auStack_78,iVar18._M_current,(value_type *)auStack_58);
                    bVar22 = 1;
                  }
                  if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              );
                  }
                }
                pOVar24 = pOVar24 + 1;
              } while (pOVar24 != pOVar8);
              uVar19 = (ulong)(((byte)~bVar22 & 1) << 4);
            }
          }
        }
        else {
          for (; (undefined1  [8])iVar18._M_current != auStack_78;
              iVar18._M_current =
                   (shared_ptr<chatra::Node> *)
                   ((long)&((iVar18._M_current)->
                           super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   lVar17)) {
            pOVar24 = *(OperatorPattern **)(pcVar21 + 8);
            pOVar8 = *(OperatorPattern **)(pcVar21 + 0x10);
            if (pOVar24 == pOVar8) {
              lVar17 = -0x10;
            }
            else {
              iVar20 = 0;
              do {
                uVar19 = (long)(pOVar24->elements).
                               super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pOVar24->elements).
                               super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                if (uVar19 <= (ulong)((long)iVar18._M_current - (long)auStack_78)) {
                  extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            ((chatra *)auStack_58,
                             (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                              )auStack_78,iVar18._M_current - uVar19,pOVar24);
                  if (auStack_58 != (undefined1  [8])0x0) {
                    iVar18 = std::
                             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                         *)auStack_78,
                                        ((long)(pOVar24->elements).
                                               super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                               ._M_impl.super__Vector_impl_data._M_start -
                                        (long)(pOVar24->elements).
                                              super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                              ._M_impl.super__Vector_impl_data._M_finish) +
                                        iVar18._M_current,iVar18);
                    iVar18 = std::
                             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                       *)auStack_78,iVar18._M_current,(value_type *)auStack_58);
                    iVar18._M_current = iVar18._M_current + 1;
                    iVar20 = 1;
                  }
                  if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              );
                  }
                }
                pOVar24 = pOVar24 + 1;
              } while (pOVar24 != pOVar8);
              lVar17 = (ulong)(uint)(iVar20 << 4) - 0x10;
            }
          }
        }
        pcVar21 = pcVar21 + 0x20;
      } while (pcVar21 != pcVar13);
    }
    pTVar5 = local_80;
    if ((auStack_78 ==
         (undefined1  [8])
         nodes.
         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       (peVar7 = ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_78)->_M_ptr,
       peVar7->type == Unknown)) {
      pTVar5 = *first._M_current;
      auStack_58 = (undefined1  [8])
                   &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      peStack_98 = (element_type *)0x13;
      auStack_58 = (undefined1  [8])
                   std::__cxx11::string::_M_create
                             ((ulong *)auStack_58,(ulong)&stack0xffffffffffffff68);
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_98;
      *(undefined8 *)auStack_58 = 0x6465746365707865;
      *(undefined8 *)((long)auStack_58 + 8) = 0x7373657270786520;
      builtin_strncpy((char *)((long)&((ParserWorkingSet *)((long)auStack_58 + 0xc))->
                                      generatedVarCount + 3),"sion",4);
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
      (&peStack_98->type)[(long)&((ParserWorkingSet *)auStack_58)->generatedVarCount] = Unknown;
      peStack_98 = (element_type *)0x0;
      __dnew = 0;
      local_88 = (pointer)0x0;
      ParserContext::errorAtToken
                ((ParserContext *)local_80,Error,pTVar5,(string *)auStack_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffff68);
    }
    else {
      if ((long)nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 == 0x10) {
        *(element_type **)this = peVar7;
        p_Var9 = (((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_78)->
                 _M_refcount)._M_pi;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var9;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
        }
        goto LAB_0019ee6b;
      }
      peVar7 = (((shared_ptr<chatra::Node> *)((long)auStack_78 + 0x10))->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      ppTVar10 = (peVar7->tokens).
                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppTVar10 ==
          (peVar7->tokens).
          super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pTVar11 = *first._M_current;
        auStack_58 = (undefined1  [8])
                     &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        peStack_98 = (element_type *)0x30;
        auStack_58 = (undefined1  [8])
                     std::__cxx11::string::_M_create
                               ((ulong *)auStack_58,(ulong)&stack0xffffffffffffff68);
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_98;
        *(undefined8 *)((long)auStack_58 + 0x20) = 0x6874206d6f726620;
        *(undefined8 *)((long)auStack_58 + 0x28) = 0x6e656b6f74207369;
        *(undefined8 *)((long)auStack_58 + 0x10) = 0x6f69737365727078;
        *(undefined8 *)((long)auStack_58 + 0x18) = 0x737472617473206e;
        *(undefined8 *)auStack_58 = 0x6f74206172747865;
        *(undefined8 *)((long)auStack_58 + 8) = 0x65206e69206e656b;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
        (&peStack_98->type)[(long)&((ParserWorkingSet *)auStack_58)->generatedVarCount] = Unknown;
        peStack_98 = (element_type *)0x0;
        __dnew = 0;
        local_88 = (pointer)0x0;
        ParserContext::errorAtToken
                  ((ParserContext *)pTVar5,Error,pTVar11,(string *)auStack_58,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff68);
      }
      else {
        pTVar11 = *ppTVar10;
        auStack_58 = (undefined1  [8])
                     &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        peStack_98 = (element_type *)0x19;
        auStack_58 = (undefined1  [8])
                     std::__cxx11::string::_M_create
                               ((ulong *)auStack_58,(ulong)&stack0xffffffffffffff68);
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_98;
        builtin_strncpy((char *)((long)&((ParserWorkingSet *)((long)auStack_58 + 8))->
                                        generatedVarCount + 1),"en in ex",8);
        builtin_strncpy((char *)((long)&((ParserWorkingSet *)((long)auStack_58 + 0x10))->
                                        generatedVarCount + 1),"pression",8);
        *(undefined8 *)auStack_58 = 0x6f74206172747865;
        *(undefined8 *)((long)auStack_58 + 8) = 0x65206e69206e656b;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
        (&peStack_98->type)[(long)&((ParserWorkingSet *)auStack_58)->generatedVarCount] = Unknown;
        peStack_98 = (element_type *)0x0;
        __dnew = 0;
        local_88 = (pointer)0x0;
        ParserContext::errorAtToken
                  ((ParserContext *)pTVar5,Error,pTVar11,(string *)auStack_58,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff68);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff68);
    if (auStack_58 !=
        (undefined1  [8])&n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ) {
      operator_delete((void *)auStack_58);
    }
  }
  createNullNode(this,*first._M_current);
LAB_0019ee6b:
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_78);
  sVar27.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar27.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar27.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> parseExpression(ParserContext& ct, TokenPtrIterator first, TokenPtrIterator last) {

	auto nodes = parseNodes(ct, first, last);
	if (nodes.empty())
		return createNullNode(**first);

	// Simple but may inefficient bottom-up parsing
	// TODO rewrite
	for (auto& group : opPatterns) {
		if (group.leftToRight) {
			for (auto it = nodes.begin(); it != nodes.end(); ) {
				bool matched = false;
				for (auto& pattern : group.patterns) {
					if (static_cast<size_t>(std::distance(it, nodes.end())) < pattern.elements.size())
						continue;
					auto n = extractOperator(nodes.begin(), it, pattern);
					if (!n)
						continue;
					it = nodes.erase(it, it + pattern.elements.size());
					it = nodes.insert(it, n);
					matched = true;
				}
				if (!matched)
					it++;
			}
		}
		else {
			for (auto it = nodes.end(); it != nodes.begin(); ) {
				bool matched = false;
				for (auto& pattern : group.patterns) {
					if (static_cast<size_t>(std::distance(nodes.begin(), it)) < pattern.elements.size())
						continue;
					auto n = extractOperator(nodes.begin(), it - pattern.elements.size(), pattern);
					if (!n)
						continue;
					it = nodes.erase(it - pattern.elements.size(), it);
					it = nodes.insert(it, n) + 1;
					matched = true;
				}
				if (!matched)
					it--;
			}
		}
	}

	if (nodes.empty() || nodes[0]->type == NodeType::Unknown) {
		ct.errorAtToken(ErrorLevel::Error, **first, "expected expression", {});
		return createNullNode(**first);
	}

	if (nodes.size() != 1) {
		if (!nodes[1]->tokens.empty())
			ct.errorAtToken(ErrorLevel::Error, *nodes[1]->tokens[0], "extra token in expression", {});
		else
			ct.errorAtToken(ErrorLevel::Error, **first, "extra token in expression starts from this token", {});
		return createNullNode(**first);
	}

	return nodes[0];
}